

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

bool __thiscall
testing::internal::
OnCallSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
::Matches(OnCallSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  undefined1 uVar2;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<std::__cxx11::string_const&>,testing::Matcher<unsigned_short>>,std::tuple<std::__cxx11::string_const&,unsigned_short>>
                    ((tuple<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                      *)(this + 0x10),args);
  if (bVar1) {
    uVar2 = (**(code **)(**(long **)(this + 0x48) + 0x20))(*(long **)(this + 0x48),args);
  }
  else {
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }